

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

SimpleString __thiscall SimpleString::printable(SimpleString *this)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  size_t extraout_RDX;
  long lVar5;
  size_t extraout_RDX_00;
  long lVar6;
  SimpleString *in_RSI;
  size_t n;
  long lVar7;
  long lVar8;
  SimpleString SVar9;
  SimpleString hexEscapeCode;
  SimpleString local_40;
  
  this->buffer_ = (char *)0x0;
  this->bufferSize_ = 0;
  copyBufferToNewInternalBuffer(this,"");
  sVar4 = getPrintableSize(in_RSI);
  setInternalBufferToNewBuffer(this,sVar4 + 1);
  lVar7 = -1;
  do {
    lVar8 = lVar7 + 1;
    lVar7 = lVar7 + 1;
  } while (in_RSI->buffer_[lVar8] != '\0');
  sVar4 = extraout_RDX;
  if (lVar7 == 0) {
    lVar8 = 0;
  }
  else {
    pcVar2 = this->buffer_;
    lVar6 = 0;
    lVar8 = 0;
    do {
      cVar1 = in_RSI->buffer_[lVar6];
      if ((byte)(cVar1 - 7U) < 7) {
        if (pcVar2 != (char *)0x0) {
          pcVar3 = printable::shortEscapeCodes[(byte)(cVar1 - 7U)];
          cVar1 = *pcVar3;
          pcVar2[lVar8] = cVar1;
          if (cVar1 != '\0') {
            pcVar2[lVar8 + 1] = pcVar3[1];
          }
        }
        lVar8 = lVar8 + 2;
      }
      else if ((byte)(cVar1 + 0x81U) < 0xa1) {
        StringFromFormat((char *)&local_40,"\\x%02X ",(ulong)(uint)(int)cVar1);
        if (pcVar2 != (char *)0x0) {
          pcVar2[lVar8] = *local_40.buffer_;
          lVar5 = 1;
          do {
            if (pcVar2[lVar5 + lVar8 + -1] == '\0') break;
            pcVar2[lVar5 + lVar8] = local_40.buffer_[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
        }
        deallocateInternalBuffer(&local_40);
        lVar8 = lVar8 + 4;
        sVar4 = extraout_RDX_00;
      }
      else {
        pcVar2[lVar8] = cVar1;
        lVar8 = lVar8 + 1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar7 != lVar6);
  }
  this->buffer_[lVar8] = '\0';
  SVar9.bufferSize_ = sVar4;
  SVar9.buffer_ = (char *)this;
  return SVar9;
}

Assistant:

SimpleString SimpleString::printable() const
{
    static const char* shortEscapeCodes[] =
    {
        "\\a",
        "\\b",
        "\\t",
        "\\n",
        "\\v",
        "\\f",
        "\\r"
    };

    SimpleString result;
    result.setInternalBufferToNewBuffer(getPrintableSize() + 1);

    size_t str_size = size();
    size_t j = 0;
    for (size_t i = 0; i < str_size; i++)
    {
        char c = buffer_[i];
        if (isControlWithShortEscapeSequence(c))
        {
            StrNCpy(&result.buffer_[j], shortEscapeCodes[(unsigned char)(c - '\a')], 2);
            j += 2;
        }
        else if (isControl(c))
        {
            SimpleString hexEscapeCode = StringFromFormat("\\x%02X ", c);
            StrNCpy(&result.buffer_[j], hexEscapeCode.asCharString(), 4);
            j += 4;
        }
        else
        {
            result.buffer_[j] = c;
            j++;
        }
    }
    result.buffer_[j] = 0;

    return result;
}